

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O3

void __thiscall
cnn::Node::forward(Node *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
                  Tensor *fx)

{
  pointer ppTVar1;
  Tensor *pTVar2;
  int iVar3;
  pointer ppTVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> xs_ptrs;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> xs_elems;
  Tensor fx_elem;
  void *local_c8;
  iterator iStack_c0;
  Tensor **local_b8;
  Node *local_a8;
  Tensor *local_a0;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_98;
  Tensor *local_78 [6];
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_48;
  
  local_a8 = this;
  iVar3 = (*this->_vptr_Node[7])();
  if ((char)iVar3 == '\0') {
    uVar7 = (fx->d).bd;
    if (uVar7 != 0) {
      if (uVar7 == 1) goto LAB_00167dea;
      uVar7 = 0;
      local_a0 = fx;
      do {
        local_98.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b8 = (Tensor **)0x0;
        local_98.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8 = (void *)0x0;
        iStack_c0._M_current = (Tensor **)0x0;
        ppTVar4 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_finish != ppTVar4) {
          uVar5 = 0;
          do {
            Tensor::batch_elem((Tensor *)local_78,ppTVar4[uVar5],uVar7);
            std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::emplace_back<cnn::Tensor>
                      (&local_98,(Tensor *)local_78);
            std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_48);
            ppTVar1 = (xs->
                      super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)
                      ._M_impl.super__Vector_impl_data._M_finish;
            ppTVar4 = (xs->
                      super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar5 = uVar5 + 1;
          } while (uVar5 < (ulong)((long)ppTVar1 - (long)ppTVar4 >> 3));
          if (ppTVar1 != ppTVar4) {
            lVar6 = 0;
            uVar5 = 0;
            do {
              local_78[0] = (Tensor *)
                            ((long)((local_98.
                                     super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->d).d + lVar6);
              if (iStack_c0._M_current == local_b8) {
                std::vector<cnn::Tensor_const*,std::allocator<cnn::Tensor_const*>>::
                _M_realloc_insert<cnn::Tensor_const*>
                          ((vector<cnn::Tensor_const*,std::allocator<cnn::Tensor_const*>> *)
                           &local_c8,iStack_c0,local_78);
              }
              else {
                *iStack_c0._M_current = local_78[0];
                iStack_c0._M_current = iStack_c0._M_current + 1;
              }
              uVar5 = uVar5 + 1;
              lVar6 = lVar6 + 0x48;
            } while (uVar5 < (ulong)((long)(xs->
                                           super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(xs->
                                           super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start >> 3));
          }
        }
        pTVar2 = local_a0;
        Tensor::batch_elem((Tensor *)local_78,local_a0,uVar7);
        (*local_a8->_vptr_Node[5])(local_a8,&local_c8,(Tensor *)local_78);
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_48);
        if (local_c8 != (void *)0x0) {
          operator_delete(local_c8);
        }
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_98);
        uVar7 = uVar7 + 1;
      } while (uVar7 < (pTVar2->d).bd);
    }
    return;
  }
LAB_00167dea:
  (*local_a8->_vptr_Node[5])(local_a8,xs,fx);
  return;
}

Assistant:

void Node::forward(const std::vector<const Tensor*>& xs,
                   Tensor& fx) const {
  if(this->supports_multibatch() || fx.d.batch_elems() == 1) {
    forward_impl(xs, fx);
  } else {
    for(unsigned b = 0; b < fx.d.batch_elems(); ++b) {
      std::vector<Tensor>  xs_elems;
      std::vector<const Tensor*> xs_ptrs;
      for(size_t i = 0; i < xs.size(); ++i) xs_elems.push_back(xs[i]->batch_elem(b));
      for(size_t i = 0; i < xs.size(); ++i) xs_ptrs.push_back(&xs_elems[i]);
      Tensor fx_elem(fx.batch_elem(b));
      forward_impl(xs_ptrs, fx_elem);
    }
  }
}